

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_expr(parser *p)

{
  int iVar1;
  char *str_00;
  char local_31;
  char *pcStack_30;
  char f;
  char *expr;
  char *str;
  char *v;
  prefs_data *d;
  parser *p_local;
  
  d = (prefs_data *)p;
  v = (char *)parser_priv(p);
  if (v != (char *)0x0) {
    str_00 = parser_getstr((parser *)d,"expr");
    pcStack_30 = string_make(str_00);
    expr = pcStack_30;
    str = process_pref_file_expr(&stack0xffffffffffffffd0,&local_31);
    iVar1 = strcmp(str,"0");
    *v = (iVar1 != 0 ^ 0xffU) & 1;
    string_free(expr);
    return PARSE_ERROR_NONE;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x249,"enum parser_error parse_prefs_expr(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_expr(struct parser *p)
{
	struct prefs_data *d = parser_priv(p);

	const char *v;
	char *str;
	char *expr;
	char f;

	assert(d != NULL);

	/* XXX this can be avoided with a rewrite of process_pref_file_expr */
	str = expr = string_make(parser_getstr(p, "expr"));

	/* Parse the expr */
	v = process_pref_file_expr(&expr, &f);

	/* Set flag */
	d->bypass = streq(v, "0");

	string_free(str);

	return PARSE_ERROR_NONE;
}